

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

Abc_Cex_t * Llb_ManReachDeriveCex(Llb_Man_t *p)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  int iVar6;
  char *string;
  Abc_Cex_t *p_00;
  DdNode *pDVar7;
  DdNode *n;
  DdNode *pDVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  iVar6 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar6);
  iVar6 = p->vRings->nSize;
  if (iVar6 < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x1dc,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,iVar6);
  pVVar2 = p->vRings;
  iVar6 = pVVar2->nSize;
  p_00->iFrame = iVar6 + -1;
  p_00->iPo = -1;
  if ((long)iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pDVar7 = Cudd_bddIntersect(p->ddR,(DdNode *)pVVar2->pArray[(long)iVar6 + -1],p->ddR->bFunc);
  Cudd_Ref(pDVar7);
  iVar6 = Cudd_bddPickOneCube(p->ddR,pDVar7,string);
  Cudd_RecursiveDeref(p->ddR,pDVar7);
  if (iVar6 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x1f2,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  pAVar3 = p->pAig;
  pVVar2 = p->vRings;
  iVar6 = pAVar3->nTruePis;
  uVar10 = pVVar2->nSize;
  iVar9 = (uVar10 - 1) * iVar6 + pAVar3->nRegs;
  if (0 < iVar6) {
    pVVar4 = pAVar3->vCis;
    lVar11 = 0;
    do {
      if (pVVar4->nSize <= (int)lVar11) goto LAB_00838ede;
      if (string[lVar11 + pAVar3->nRegs] == '\x01') {
        iVar6 = iVar9 + (int)lVar11;
        (&p_00[1].iPo)[iVar6 >> 5] = (&p_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
        iVar6 = pAVar3->nTruePis;
      }
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 < iVar6);
    uVar10 = pVVar2->nSize;
  }
  if ((int)uVar10 < 2) {
    pDVar7 = (DdNode *)0x0;
  }
  else {
    pDVar7 = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
    Cudd_Ref(pDVar7);
    uVar10 = p->vRings->nSize;
  }
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
    do {
      uVar10 = p->vRings->nSize;
      if ((long)(int)uVar10 < (long)uVar12) goto LAB_00838ede;
      uVar1 = uVar12 - 1;
      if (uVar12 != uVar10) {
        pDVar8 = (DdNode *)p->vRings->pArray[uVar1];
        n = Llb_ManComputeImage(p,pDVar7,1);
        if (n == (DdNode *)0x0) {
          __assert_fail("bImage != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x208,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,pDVar7);
        pDVar7 = Extra_TransferPermute(p->dd,p->ddR,n,p->vCs2Glo->pArray);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,n);
        pDVar8 = Cudd_bddIntersect(p->ddR,pDVar7,pDVar8);
        Cudd_Ref(pDVar8);
        Cudd_RecursiveDeref(p->ddR,pDVar7);
        iVar6 = Cudd_bddPickOneCube(p->ddR,pDVar8,string);
        Cudd_RecursiveDeref(p->ddR,pDVar8);
        if (iVar6 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x219,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
        }
        pAVar3 = p->pAig;
        iVar6 = pAVar3->nTruePis;
        iVar9 = iVar9 - iVar6;
        if (0 < iVar6) {
          pVVar2 = pAVar3->vCis;
          lVar11 = 0;
          do {
            if (pVVar2->nSize <= (int)lVar11) goto LAB_00838ede;
            if (string[lVar11 + pAVar3->nRegs] == '\x01') {
              iVar6 = iVar9 + (int)lVar11;
              (&p_00[1].iPo)[iVar6 >> 5] = (&p_00[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
              iVar6 = pAVar3->nTruePis;
            }
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 < iVar6);
        }
        if (uVar1 == 0) {
          if (0 < (long)pAVar3->nRegs) {
            lVar11 = 0;
            goto LAB_00838e68;
          }
          break;
        }
        pDVar7 = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
        Cudd_Ref(pDVar7);
      }
      bVar5 = 1 < (long)uVar12;
      uVar12 = uVar1;
    } while (bVar5);
  }
LAB_00838e8d:
  if (iVar9 != p->pAig->nRegs) {
    __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x230,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  iVar6 = Saig_ManFindFailedPoCex(p->pAigGlo,p_00);
  if ((-1 < iVar6) && (iVar6 < p->pAigGlo->nTruePos)) {
    p_00->iPo = iVar6;
    if (string != (char *)0x0) {
      free(string);
    }
    return p_00;
  }
  __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                ,0x234,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  while( true ) {
    if (string[lVar11] != '\0') {
      __assert_fail("pValues[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                    ,0x229,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
    }
    lVar11 = lVar11 + 1;
    if (pAVar3->nRegs == lVar11) break;
LAB_00838e68:
    if ((iVar6 < 0) || (pAVar3->vCis->nSize <= iVar6 + (int)lVar11)) {
LAB_00838ede:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  goto LAB_00838e8d;
}

Assistant:

Abc_Cex_t * Llb_ManReachDeriveCex( Llb_Man_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

/*
    Saig_ManForEachLo( p->pAig, pObj, i )
        printf( "%d ", pObj->Id );
    printf( "\n" );
    Saig_ManForEachLi( p->pAig, pObj, i )
        printf( "%d(%d) ", pObj->Id, Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
//Extra_bddPrintSupport( p->dd, bState );  printf( "\n" );
//Extra_bddPrintSupport( p->dd, bRing );   printf( "\n" );
        // compute the next states
        bImage = Llb_ManComputeImage( p, bState, 1 ); 
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage );  printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
//Extra_bddPrintSupport( p->ddR, bImage );  printf( "\n" );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );
/*
        for ( i = 0; i < p->ddR->size; i++ )
            printf( "%d ", pValues[i] );
        printf( "\n" );
*/
        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
//Abc_CexPrint( pCex );
    RetValue = Saig_ManFindFailedPoCex( p->pAigGlo, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    return pCex;
}